

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O1

void res0_free_look(vorbis_look_residue *i)

{
  void *__ptr;
  long lVar1;
  
  if (i != (vorbis_look_residue *)0x0) {
    if (0 < *(int *)((long)i + 8)) {
      lVar1 = 0;
      do {
        __ptr = *(void **)(*(long *)((long)i + 0x20) + lVar1 * 8);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < *(int *)((long)i + 8));
    }
    free(*(void **)((long)i + 0x20));
    if (0 < *(int *)((long)i + 0x28)) {
      lVar1 = 0;
      do {
        free(*(void **)(*(long *)((long)i + 0x30) + lVar1 * 8));
        lVar1 = lVar1 + 1;
      } while (lVar1 < *(int *)((long)i + 0x28));
    }
    free(*(void **)((long)i + 0x30));
    *(undefined8 *)((long)i + 0x40) = 0;
    *(undefined8 *)((long)i + 0x48) = 0;
    *(undefined8 *)((long)i + 0x30) = 0;
    *(undefined8 *)((long)i + 0x38) = 0;
    *(undefined8 *)((long)i + 0x20) = 0;
    *(undefined8 *)((long)i + 0x28) = 0;
    *(undefined8 *)((long)i + 0x10) = 0;
    *(undefined8 *)((long)i + 0x18) = 0;
    *(undefined8 *)i = 0;
    *(undefined8 *)((long)i + 8) = 0;
    free(i);
    return;
  }
  return;
}

Assistant:

void res0_free_look(vorbis_look_residue *i){
  int j;
  if(i){

    vorbis_look_residue0 *look=(vorbis_look_residue0 *)i;

#ifdef TRAIN_RES
    {
      int j,k,l;
      for(j=0;j<look->parts;j++){
        /*fprintf(stderr,"partition %d: ",j);*/
        for(k=0;k<8;k++)
          if(look->training_data[k][j]){
            char buffer[80];
            FILE *of;
            codebook *statebook=look->partbooks[j][k];

            /* long and short into the same bucket by current convention */
            sprintf(buffer,"res_sub%d_part%d_pass%d.vqd",look->submap,j,k);
            of=fopen(buffer,"a");

            for(l=0;l<statebook->entries;l++)
              fprintf(of,"%d:%ld\n",l,look->training_data[k][j][l]);

            fclose(of);

            /*fprintf(stderr,"%d(%.2f|%.2f) ",k,
              look->training_min[k][j],look->training_max[k][j]);*/

            _ogg_free(look->training_data[k][j]);
            look->training_data[k][j]=NULL;
          }
        /*fprintf(stderr,"\n");*/
      }
    }
    fprintf(stderr,"min/max residue: %g::%g\n",look->tmin,look->tmax);

    /*fprintf(stderr,"residue bit usage %f:%f (%f total)\n",
            (float)look->phrasebits/look->frames,
            (float)look->postbits/look->frames,
            (float)(look->postbits+look->phrasebits)/look->frames);*/
#endif


    /*vorbis_info_residue0 *info=look->info;

    fprintf(stderr,
            "%ld frames encoded in %ld phrasebits and %ld residue bits "
            "(%g/frame) \n",look->frames,look->phrasebits,
            look->resbitsflat,
            (look->phrasebits+look->resbitsflat)/(float)look->frames);

    for(j=0;j<look->parts;j++){
      long acc=0;
      fprintf(stderr,"\t[%d] == ",j);
      for(k=0;k<look->stages;k++)
        if((info->secondstages[j]>>k)&1){
          fprintf(stderr,"%ld,",look->resbits[j][k]);
          acc+=look->resbits[j][k];
        }

      fprintf(stderr,":: (%ld vals) %1.2fbits/sample\n",look->resvals[j],
              acc?(float)acc/(look->resvals[j]*info->grouping):0);
    }
    fprintf(stderr,"\n");*/

    for(j=0;j<look->parts;j++)
      if(look->partbooks[j])_ogg_free(look->partbooks[j]);
    _ogg_free(look->partbooks);
    for(j=0;j<look->partvals;j++)
      _ogg_free(look->decodemap[j]);
    _ogg_free(look->decodemap);

    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}